

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O2

ktx_error_code_e
linearTilingPadCallback
          (int miplevel,int face,int width,int height,int depth,ktx_uint64_t faceLodSize,
          void *pixels,void *userdata)

{
  long lVar1;
  ktx_uint32_t kVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  void *__src;
  VkDeviceSize VVar9;
  bool bVar10;
  VkSubresourceLayout subResLayout;
  VkImageSubresource subRes;
  
  subRes.aspectMask = 1;
  subRes.mipLevel = miplevel;
  subRes.arrayLayer = face;
  (**(code **)((long)userdata + 0xa8))
            (*(undefined8 *)((long)userdata + 0xf8),*(undefined8 *)((long)userdata + 0xf0),&subRes,
             &subResLayout);
  kVar2 = ktxTexture_GetRowPitch(*(ktxTexture **)((long)userdata + 0x108),miplevel);
  uVar6 = (ulong)kVar2;
  if (subResLayout.rowPitch == uVar6) {
    height = 1;
  }
  lVar1 = *(long *)((long)userdata + 0x108);
  if ((*(uint *)(lVar1 + 0x38) < 2) && (*(int *)(lVar1 + 0x30) != 3)) {
    uVar3 = 0;
joined_r0x001c7e15:
    uVar8 = 1;
    uVar7 = uVar3;
    if ((uint)height < 2) goto LAB_001c7e7c;
  }
  else {
    uVar3 = (**(code **)(*(long *)(lVar1 + 8) + 0x18))(lVar1,miplevel);
    uVar5 = *(uint *)(*(long *)((long)userdata + 0x108) + 0x38);
    if (uVar5 < 2) {
      uVar8 = (ulong)(uint)depth;
      uVar7 = subResLayout.depthPitch;
      if (subResLayout.depthPitch == uVar3) {
        uVar8 = 1;
      }
    }
    else {
      if (subResLayout.arrayPitch == uVar3) goto joined_r0x001c7e15;
      uVar8 = (ulong)(uVar5 * *(int *)(*(long *)((long)userdata + 0x108) + 0x3c));
      uVar7 = subResLayout.arrayPitch;
    }
    if (uVar7 < uVar3) {
      __assert_fail("imageSize <= imagePitch",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                    ,0x2c5,
                    "ktx_error_code_e linearTilingPadCallback(int, int, int, int, int, ktx_uint64_t, void *, void *)"
                   );
    }
    if ((uint)height < 2) {
      if (1 < (uint)uVar8) {
        faceLodSize = faceLodSize / uVar8;
      }
      goto LAB_001c7e7c;
    }
  }
  faceLodSize = subResLayout.rowPitch;
  if (uVar6 <= subResLayout.rowPitch) {
    faceLodSize = uVar6;
  }
LAB_001c7e7c:
  for (uVar4 = 0; uVar4 != uVar8; uVar4 = uVar4 + 1) {
    __src = (void *)(uVar3 * uVar4 + (long)pixels);
    VVar9 = subResLayout.offset;
    uVar5 = height;
    while (bVar10 = uVar5 != 0, uVar5 = uVar5 - 1, bVar10) {
      memcpy((void *)(*(long *)((long)userdata + 0x100) + VVar9),__src,faceLodSize);
      VVar9 = VVar9 + subResLayout.rowPitch;
      __src = (void *)((long)__src + uVar6);
    }
    subResLayout.offset = VVar9 + uVar7;
  }
  return KTX_SUCCESS;
}

Assistant:

KTX_error_code
linearTilingPadCallback(int miplevel, int face,
                      int width, int height, int depth,
                      ktx_uint64_t faceLodSize,
                      void* pixels, void* userdata)
{
    user_cbdata_linear* ud = (user_cbdata_linear*)userdata;
    VkDeviceSize offset;
    ktx_size_t   imageSize = 0;
    VkDeviceSize imagePitch = 0;
    ktx_uint32_t srcRowPitch;
    ktx_uint32_t rowIterations;
    ktx_uint32_t imageIterations;
    ktx_uint32_t row, image;
    ktx_uint8_t* pSrc;
    ktx_size_t   copySize;
    VkSubresourceLayout subResLayout;
#if !defined(_MSC_VER) || _MSC_VER >= 1920
    VkImageSubresource subRes = {
      .aspectMask = VK_IMAGE_ASPECT_COLOR_BIT,
      .mipLevel = miplevel,
      .arrayLayer = face
    };
#else
    VkImageSubresource subRes = {0};
    subRes.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
    subRes.mipLevel = miplevel;
    subRes.arrayLayer = face;
#endif

    UNUSED(width);

    // Get sub resources layout. Includes row pitch, size,
    // offsets, etc.
    ud->vkFuncs.vkGetImageSubresourceLayout(ud->device, ud->destImage, &subRes,
                                &subResLayout);

    srcRowPitch = ktxTexture_GetRowPitch(ud->texture, miplevel);

    if (subResLayout.rowPitch != srcRowPitch)
        rowIterations = height;
    else
        rowIterations = 1;

    imageIterations = 1;
    // Arrays, including cube map arrays, or 3D textures
    // Note from the Vulkan spec:
    //  *  arrayPitch is undefined for images that were not
    //     created as arrays.
    //  *  depthPitch is defined only for 3D images.
    if (ud->texture->numLayers > 1 || ud->texture->numDimensions == 3) {
        imageSize = ktxTexture_GetImageSize(ud->texture, miplevel);
        if (ud->texture->numLayers > 1) {
            imagePitch = subResLayout.arrayPitch;
            if (imagePitch != imageSize)
                imageIterations
                        = ud->texture->numLayers * ud->texture->numFaces;
        } else {
            imagePitch = subResLayout.depthPitch;
            if (imagePitch != imageSize)
                imageIterations = depth;
        }
        assert(imageSize <= imagePitch);
    }

    if (rowIterations > 1) {
        // Copy the minimum of srcRowPitch, the GL_UNPACK_ALIGNMENT padded size,
        // and subResLayout.rowPitch.
        if (subResLayout.rowPitch < srcRowPitch)
            copySize = subResLayout.rowPitch;
        else
            copySize = srcRowPitch;
    } else if (imageIterations > 1)
        copySize = faceLodSize / imageIterations;
    else
        copySize = faceLodSize;

    offset = subResLayout.offset;
    // Copy image data to destImage via its mapped memory.
    for (image = 0; image < imageIterations; image++) {
        pSrc = (ktx_uint8_t*)pixels + imageSize * image;
        for (row = 0; row < rowIterations; row++) {
            memcpy(ud->dest + offset, pSrc, copySize);
            offset += subResLayout.rowPitch;
            pSrc += srcRowPitch;
          }
        offset += imagePitch;
    }
    return KTX_SUCCESS;
}